

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O1

void __thiscall libDAI::NDP::SelectStateForVar(NDP *this,size_t varOrderI)

{
  pointer puVar1;
  ulong uVar2;
  pointer pvVar3;
  byte bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pTVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> indivIndices;
  nb_type vsI;
  multind mi;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  nb_type local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  multind local_50;
  
  pTVar15 = (this->_m_newFacs).
            super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(this->_m_newFacs).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar15 >> 3) *
          0x6db6db6db6db6db7;
  if (uVar9 < varOrderI || uVar9 - varOrderI == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",varOrderI
              );
  }
  pTVar15 = pTVar15 + varOrderI;
  NBFromVarSet(&local_80,this,&pTVar15->_vs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,
             (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_50);
  if ((long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar8 = (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    puVar1 = (this->_m_bestConfiguration).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(this->_m_bestConfiguration).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    uVar13 = (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    uVar14 = 0;
    do {
      uVar2 = local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14];
      uVar10 = uVar9;
      uVar12 = uVar2;
      if ((uVar9 <= uVar2) || (uVar10 = uVar13, uVar12 = uVar13, uVar13 == uVar14)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12,uVar10);
      }
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14] = puVar1[uVar2];
      uVar14 = uVar14 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != uVar14);
  }
  multind::multind(&local_50,&pTVar15->_vs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_68,&local_98);
  if ((long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar9 = 0;
  }
  else {
    lVar8 = (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    auVar17 = vpbroadcastq_avx512f();
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    uVar9 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar19 = vmovdqa64_avx512f(auVar22);
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar22,auVar18);
      uVar13 = vpcmpuq_avx512f(auVar22,auVar17,2);
      auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (local_68.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar9));
      bVar4 = (byte)uVar13;
      auVar20._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar22._8_8_;
      auVar20._0_8_ = (ulong)(bVar4 & 1) * auVar22._0_8_;
      auVar20._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar22._16_8_;
      auVar20._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar22._24_8_;
      auVar20._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar22._32_8_;
      auVar20._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar22._40_8_;
      auVar20._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar22._48_8_;
      auVar20._56_8_ = (uVar13 >> 7) * auVar22._56_8_;
      auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (local_50._pdims.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar9));
      auVar21._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar22._8_8_;
      auVar21._0_8_ = (ulong)(bVar4 & 1) * auVar22._0_8_;
      auVar21._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar22._16_8_;
      auVar21._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar22._24_8_;
      auVar21._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar22._32_8_;
      auVar21._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar22._40_8_;
      auVar21._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar22._48_8_;
      auVar21._56_8_ = (uVar13 >> 7) * auVar22._56_8_;
      auVar22 = vpmullq_avx512dq(auVar21,auVar20);
      auVar22 = vpaddq_avx512f(auVar22,auVar19);
      uVar9 = uVar9 + 8;
    } while ((lVar8 + (ulong)(lVar8 == 0) + 7 & 0xfffffffffffffff8) != uVar9);
    auVar17 = vmovdqa64_avx512f(auVar22);
    auVar18._0_8_ = (ulong)(bVar4 & 1) * auVar17._0_8_ | (ulong)!(bool)(bVar4 & 1) * auVar19._0_8_;
    bVar5 = (bool)((byte)(uVar13 >> 1) & 1);
    auVar18._8_8_ = (ulong)bVar5 * auVar17._8_8_ | (ulong)!bVar5 * auVar19._8_8_;
    bVar5 = (bool)((byte)(uVar13 >> 2) & 1);
    auVar18._16_8_ = (ulong)bVar5 * auVar17._16_8_ | (ulong)!bVar5 * auVar19._16_8_;
    bVar5 = (bool)((byte)(uVar13 >> 3) & 1);
    auVar18._24_8_ = (ulong)bVar5 * auVar17._24_8_ | (ulong)!bVar5 * auVar19._24_8_;
    bVar5 = (bool)((byte)(uVar13 >> 4) & 1);
    auVar18._32_8_ = (ulong)bVar5 * auVar17._32_8_ | (ulong)!bVar5 * auVar19._32_8_;
    bVar5 = (bool)((byte)(uVar13 >> 5) & 1);
    auVar18._40_8_ = (ulong)bVar5 * auVar17._40_8_ | (ulong)!bVar5 * auVar19._40_8_;
    bVar5 = (bool)((byte)(uVar13 >> 6) & 1);
    auVar18._48_8_ = (ulong)bVar5 * auVar17._48_8_ | (ulong)!bVar5 * auVar19._48_8_;
    auVar18._56_8_ = (uVar13 >> 7) * auVar17._56_8_ | (ulong)!SUB81(uVar13 >> 7,0) * auVar19._56_8_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpaddq_avx512f(auVar18,ZEXT3264(auVar16));
    auVar6 = vpaddq_avx(auVar17._0_16_,auVar17._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpaddq_avx(auVar6,auVar7);
    uVar9 = auVar6._0_8_;
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (this->_m_bestResps).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((long)(this->_m_bestResps).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
           -0x5555555555555555;
  sVar11 = varOrderI;
  if ((varOrderI <= uVar13 && uVar13 - varOrderI != 0) &&
     (lVar8 = *(long *)&pvVar3[varOrderI].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data, sVar11 = uVar9,
     uVar9 < (ulong)((long)*(pointer *)
                            ((long)&pvVar3[varOrderI].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data + 8) - lVar8 >> 3))) {
    puVar1 = (this->_m_varOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (varOrderI <
        (ulong)((long)(this->_m_varOrder).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
      varOrderI = puVar1[varOrderI];
      puVar1 = (this->_m_bestConfiguration).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (varOrderI <
          (ulong)((long)(this->_m_bestConfiguration).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
        puVar1[varOrderI] = *(unsigned_long *)(lVar8 + uVar9 * 8);
        if (local_50._pdims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50._pdims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50._pdims.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50._pdims.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_50._dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50._dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50._dims.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50._dims.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",varOrderI
              );
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",sVar11);
}

Assistant:

void NDP::SelectStateForVar(size_t varOrderI)
    {
        //get the factor that was introduced when eliminating varOrderI
        Factor& fI = _m_newFacs.at(varOrderI);
        
        //get the variables involved
        const VarSet & vs = fI.vars();
        nb_type vsI = NBFromVarSet(vs);
        
        //see what states they have selected
        std::vector<size_t> indivIndices( vsI.size() );
        for(size_t i=0; i < vsI.size(); i++)
        {
            size_t nvI = vsI.at(i);
            indivIndices.at(i) = _m_bestConfiguration.at(nvI);
        }

        //compute the joint state
        multind mi(vs);
        size_t jI = mi.li( indivIndices );
        //size_t jI2 = Factor::IndividualToJointFactorIndex(vs, indivIndices);
        //if (jI != jI2)
            //cout << "(jI != jI2): " << jI <<"!="<< jI2 << endl;

        //look up varOrderI's best response
        size_t br = _m_bestResps.at(varOrderI).at(jI);

        //register varOrderI's choice
        size_t varI = _m_varOrder.at(varOrderI);
        _m_bestConfiguration.at(varI) = br;
    }